

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O1

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,unsigned_long_long i)

{
  bool bVar1;
  char cVar2;
  unsigned_long_long uVar3;
  char cVar4;
  string __str;
  long *local_40;
  uint local_38;
  undefined4 uStack_34;
  long local_30 [2];
  
  cVar4 = '\x01';
  if (9 < i) {
    uVar3 = i;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00143bc1;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00143bc1;
      }
      if (uVar3 < 10000) goto LAB_00143bc1;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00143bc1:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_40,local_38,i);
  (*this->_vptr_Pipeline[2])(this,local_40,CONCAT44(uStack_34,local_38));
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(unsigned long long i)
{
    this->writeString(std::to_string(i));
    return *this;
}